

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

token * collect_arg(dmr_C *C,token *prev,int vararg,position *pos,int count)

{
  byte *pbVar1;
  uint uVar2;
  stream *psVar3;
  position pVar4;
  position pVar5;
  ulong uVar6;
  uint uVar7;
  position *line;
  bool bVar8;
  int local_34;
  
  uVar2 = *(uint *)&prev->pos;
  psVar3 = C->T->input_streams;
  local_34 = 0;
LAB_001218f1:
  line = (position *)((long)prev + 8);
  do {
    prev = *(token **)line;
    if ((*(uint *)prev & 0x3f) == 0x19) {
      do {
        pbVar1 = (byte *)(*(long *)((long)prev + 0x10) + 0x11);
        *pbVar1 = *pbVar1 & 0xfe;
        prev = *(token **)((long)prev + 8);
      } while ((*(uint *)prev & 0x3f) == 0x19);
      *line = (position)prev;
    }
    if (prev == &dmrC_eof_token_entry_) goto LAB_00121a54;
    pVar4 = prev->pos;
    if ((((pVar4._0_4_ & 0x10003f) == 0x100011) && (-1 < (long)pVar4)) &&
       (*(uint *)((long)prev + 0x10) == 0x23)) {
      dmrC_sparse_error(C,pVar4,"directive in argument list");
      preprocessor_line(C,(stream *)((long)&psVar3->fd + (ulong)((uVar2 >> 6 & 0x3fff) * 0x48)),
                        (token **)line);
    }
    else {
      uVar7 = pVar4._0_4_ & 0x3f;
      if (uVar7 - 0xf < 2) {
        if (1 < count) {
          *(uint *)*(position *)((long)prev + 0x10) =
               *(uint *)*(position *)((long)prev + 0x10) | 0x80000000;
        }
      }
      else if (uVar7 - 0x12 < 2) goto LAB_00121a54;
      if (C->false_nesting == 0) break;
      *line = *(position *)((long)prev + 8);
    }
    dmrC_allocator_free(&C->token_allocator,prev);
  } while( true );
  pVar4 = prev->pos;
  if ((pVar4._0_4_ & 0x3f) == 0x11) {
    uVar7 = *(uint *)((long)prev + 0x10);
    if (uVar7 == 0x29) {
      bVar8 = local_34 == 0;
      local_34 = local_34 + -1;
      if (bVar8) {
LAB_00121a54:
        *line = (position)&dmrC_eof_token_entry_;
        return (token *)(position)prev;
      }
    }
    else if (uVar7 == 0x28) {
      local_34 = local_34 + 1;
    }
    else if ((uVar7 == 0x2c) && (local_34 == 0 && vararg == 0)) goto LAB_00121a54;
  }
  uVar6 = (ulong)(SUB84(*pos,0) & 0xfffc0);
  *(ulong *)prev = (ulong)pVar4 & 0xfffffffffff0003f | uVar6;
  pVar5 = *pos;
  *(ulong *)prev = (ulong)pVar4 & 0x80000000fff0003f | uVar6 | (ulong)pVar5 & 0x7fffffff00000000;
  *(ulong *)prev =
       (ulong)pVar4 & 0x800000000030003f | uVar6 | (ulong)pVar5 & 0x7fffffff00000000 |
       (ulong)(SUB84(*pos,0) & 0xffc00000);
  goto LAB_001218f1;
}

Assistant:

static struct token *collect_arg(struct dmr_C *C, struct token *prev, int vararg, struct position *pos, int count)
{
	struct stream *stream = C->T->input_streams + prev->pos.stream;
	struct token **p = &prev->next;
	struct token *next;
	int nesting = 0;

	while (!dmrC_eof_token(next = scan_next(C, p))) {
		if (next->pos.newline && dmrC_match_op(next, '#')) {
			if (!next->pos.noexpand) {
				dmrC_sparse_error(C, next->pos,
					     "directive in argument list");
				preprocessor_line(C, stream, p);
				dmrC_allocator_free(&C->token_allocator, next);	/* Free the '#' token */
				continue;
			}
		}
		switch (dmrC_token_type(next)) {
		case TOKEN_STREAMEND:
		case TOKEN_STREAMBEGIN:
			*p = &dmrC_eof_token_entry_;
			return next;
		case TOKEN_STRING:
		case TOKEN_WIDE_STRING:
			if (count > 1)
				next->string->immutable = 1;
			break;
		}
		if (C->false_nesting) {
			*p = next->next;
			dmrC_allocator_free(&C->token_allocator, next);
			continue;
		}
		if (dmrC_match_op(next, '(')) {
			nesting++;
		} else if (dmrC_match_op(next, ')')) {
			if (!nesting--)
				break;
		} else if (dmrC_match_op(next, ',') && !nesting && !vararg) {
			break;
		}
		next->pos.stream = pos->stream;
		next->pos.line = pos->line;
		next->pos.pos = pos->pos;
		p = &next->next;
	}
	*p = &dmrC_eof_token_entry_;
	return next;
}